

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O2

void __thiscall SHMException::SHMException(SHMException *this,string *message)

{
  *(undefined ***)this = &PTR__SHMException_00106cb8;
  std::__cxx11::string::string((string *)&this->message,(string *)message);
  return;
}

Assistant:

SHMException::SHMException( const std::string &message ) : std::exception(),
                                                           message( message )
{
}